

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void blend_linear_gradient
               (plutovg_surface_t *surface,plutovg_operator_t op,gradient_data_t *gradient,
               plutovg_span_buffer_t *span_buffer)

{
  composition_function_t p_Var1;
  int local_1074;
  uint32_t *target;
  int local_1060;
  int l;
  int x;
  int length;
  plutovg_span_t *spans;
  undefined1 local_1048 [4];
  int count;
  linear_gradient_values_t v;
  uint buffer [1024];
  composition_function_t func;
  plutovg_span_buffer_t *span_buffer_local;
  gradient_data_t *gradient_local;
  plutovg_operator_t op_local;
  plutovg_surface_t *surface_local;
  
  p_Var1 = composition_table[op];
  local_1048 = (undefined1  [4])((gradient->values).linear.x2 - (gradient->values).linear.x1);
  count = (int)((gradient->values).linear.y2 - (gradient->values).linear.y1);
  v.dx = (float)local_1048 * (float)local_1048 + (float)count * (float)count;
  v.dy = 0.0;
  if ((v.dx != 0.0) || (NAN(v.dx))) {
    local_1048 = (undefined1  [4])((float)local_1048 / v.dx);
    count = (int)((float)count / v.dx);
    v.dy = -(float)local_1048 * (gradient->values).linear.x1 +
           -((float)count * (gradient->values).linear.y1);
  }
  _x = (span_buffer->spans).data;
  spans._4_4_ = (span_buffer->spans).size;
  while (spans._4_4_ != 0) {
    local_1060 = _x->x;
    for (l = _x->len; l != 0; l = l - local_1074) {
      if (l < 0x400) {
        local_1074 = l;
      }
      else {
        local_1074 = 0x400;
      }
      fetch_linear_gradient
                ((uint32_t *)&v.l,(linear_gradient_values_t *)local_1048,gradient,_x->y,local_1060,
                 local_1074);
      (*p_Var1)((uint32_t *)(surface->data + (long)local_1060 * 4 + (long)(_x->y * surface->stride))
                ,local_1074,(uint32_t *)&v.l,(uint32_t)_x->coverage);
      local_1060 = local_1074 + local_1060;
    }
    _x = _x + 1;
    spans._4_4_ = spans._4_4_ + -1;
  }
  return;
}

Assistant:

static void blend_linear_gradient(plutovg_surface_t* surface, plutovg_operator_t op, const gradient_data_t* gradient, const plutovg_span_buffer_t* span_buffer)
{
    composition_function_t func = composition_table[op];
    unsigned int buffer[BUFFER_SIZE];

    linear_gradient_values_t v;
    v.dx = gradient->values.linear.x2 - gradient->values.linear.x1;
    v.dy = gradient->values.linear.y2 - gradient->values.linear.y1;
    v.l = v.dx * v.dx + v.dy * v.dy;
    v.off = 0.f;
    if(v.l != 0.f) {
        v.dx /= v.l;
        v.dy /= v.l;
        v.off = -v.dx * gradient->values.linear.x1 - v.dy * gradient->values.linear.y1;
    }

    int count = span_buffer->spans.size;
    const plutovg_span_t* spans = span_buffer->spans.data;
    while(count--) {
        int length = spans->len;
        int x = spans->x;
        while(length) {
            int l = plutovg_min(length, BUFFER_SIZE);
            fetch_linear_gradient(buffer, &v, gradient, spans->y, x, l);
            uint32_t* target = (uint32_t*)(surface->data + spans->y * surface->stride) + x;
            func(target, l, buffer, spans->coverage);
            x += l;
            length -= l;
        }

        ++spans;
    }
}